

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

File * File::parse_file_text(File *__return_storage_ptr__,ifstream *in)

{
  bool bVar1;
  __type _Var2;
  int32_t iVar3;
  uint uVar4;
  int iVar5;
  istream *piVar6;
  long *plVar7;
  reference pvVar8;
  variant_alternative_t<0UL,_variant<basic_string<char>,_int,_double>_> *pvVar9;
  reference pvVar10;
  int iVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  char cVar15;
  string *s;
  int j;
  ulong __n;
  char ch_1;
  anon_class_8_1_02a47b0a errorInvalidFile;
  vector<vm::Function,_std::allocator<vm::Function>_> functions;
  string temp;
  ulong local_940;
  string type;
  vector<vm::Constant,_std::allocator<vm::Constant>_> constants;
  anon_class_16_2_9d8d2ce4 ensureNoMoreInput;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> start;
  anon_class_40_5_6335b36b parseInstructions;
  int line_count;
  anon_class_16_2_51529e6d reuseLine;
  string str;
  vector<vm::Function,_std::allocator<vm::Function>_> local_848;
  _Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_> local_828;
  vector<vm::Constant,_std::allocator<vm::Constant>_> local_808;
  anon_class_32_4_7e715f1c readLine;
  string local_7c8;
  string local_7a8;
  string local_788 [2];
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8 [2];
  string local_668 [2];
  string local_628;
  string local_608;
  string local_5e8 [2];
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508 [2];
  string local_4c8 [2];
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string line;
  stringstream ss;
  string local_2b0 [368];
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  anon_class_16_2_ad521349 errorLineInfo;
  string local_50;
  
  line_count = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&line,"",(allocator<char> *)&ss);
  std::__cxx11::string::string<std::allocator<char>>((string *)&str,"",(allocator<char> *)&ss);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  readLine.line_count = &line_count;
  errorInvalidFile.errorLineInfo = &errorLineInfo;
  ensureNoMoreInput.errorInvalidFile = &errorInvalidFile;
  ensureNoMoreInput.ss = &ss;
  reuseLine.ss = &ss;
  reuseLine.line = &line;
  readLine.in = in;
  readLine.line = &line;
  readLine.ss = &ss;
  errorLineInfo.line_count = readLine.line_count;
  errorLineInfo.line = &line;
  parse_file_text::anon_class_32_4_7e715f1c::operator()(&readLine);
  constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator>>((istream *)&ss,(string *)&str);
  bVar1 = std::operator==(&str,".constants:");
  if (!bVar1) goto LAB_00111136;
  parse_file_text::anon_class_16_2_9d8d2ce4::operator()(&ensureNoMoreInput);
  while( true ) {
    parse_file_text::anon_class_32_4_7e715f1c::operator()(&readLine);
    parseInstructions.ss = (stringstream *)&parseInstructions.errorInvalidFile;
    parseInstructions.reuseLine = (anon_class_16_2_51529e6d *)0x0;
    parseInstructions.errorInvalidFile =
         (anon_class_8_1_02a47b0a *)((ulong)parseInstructions.errorInvalidFile & 0xffffffffffffff00)
    ;
    temp._M_dataplus._M_p = (pointer)&temp.field_2;
    temp._M_string_length = 0;
    type._M_dataplus._M_p = (pointer)&type.field_2;
    type._M_string_length = 0;
    temp.field_2._M_allocated_capacity = temp.field_2._M_allocated_capacity & 0xffffffffffffff00;
    type.field_2._M_local_buf[0] = '\0';
    start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)start.
                          super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    piVar6 = std::operator>>((istream *)&ss,(string *)&temp);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::string((string *)&local_80,(string *)&temp);
    iVar3 = try_to_int(&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if (((long)constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x30 != (long)iVar3) goto LAB_00110e30;
    piVar6 = std::operator>>((istream *)&ss,(string *)&type);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) goto LAB_00110e5b;
    bVar1 = std::operator==(&type,"S");
    if (bVar1) {
      parseInstructions.readLine =
           (anon_class_32_4_7e715f1c *)((ulong)parseInstructions.readLine & 0xffffffffffffff00);
      *(uint *)(local_2b0 + *(long *)(_ss + -0x18)) =
           *(uint *)(local_2b0 + *(long *)(_ss + -0x18)) | 0x1000;
      piVar6 = std::operator>>((istream *)&ss,(char *)&functions);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) goto LAB_00110f07;
      if ((byte)functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                super__Vector_impl_data._M_start != '\"') goto LAB_00110edc;
LAB_001102a9:
      plVar7 = (long *)std::istream::get((char *)&ss);
      if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_388,"no trailing quote for string constant",
                   (allocator<char> *)&ch_1);
        parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_388);
LAB_00110d03:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,"incomplete escape seq",(allocator<char> *)&ch_1);
        parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_3a8);
LAB_00110d2e:
        strfmt<char>(&local_448,"unknown escape seq \"\\{}\"",(char *)&functions);
        parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_448);
LAB_00110d59:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"incomplete hex escape seq",(allocator<char> *)&ch_1);
        parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_3c8);
LAB_00110d84:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3e8,"invalid hex escape seq",(allocator<char> *)&ch_1);
        parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_3e8);
LAB_00110daf:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_428,"invalid hex escape seq",(allocator<char> *)&ch_1);
        parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_428);
LAB_00110dda:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_408,"incomplete hex escape seq",(allocator<char> *)&ch_1);
        parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_408);
        goto LAB_00110e05;
      }
      cVar15 = (char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&start;
      if ((byte)functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                super__Vector_impl_data._M_start == '\\') {
        plVar7 = (long *)std::istream::get((char *)&ss);
        if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0)
        goto LAB_00110d03;
        if (((((byte)functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                     _M_impl.super__Vector_impl_data._M_start - 0x22 < 0x3b) &&
             ((0x400000000000021U >>
               ((ulong)((byte)functions.
                              super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                              _M_impl.super__Vector_impl_data._M_start - 0x22) & 0x3f) & 1) != 0))
            || ((byte)functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                      _M_impl.super__Vector_impl_data._M_start == 0x6e)) ||
           (((byte)functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl
                   .super__Vector_impl_data._M_start == 0x72 ||
            ((byte)functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl
                   .super__Vector_impl_data._M_start == 0x74)))) goto LAB_001103d3;
        if ((byte)functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                  super__Vector_impl_data._M_start != 0x78) goto LAB_00110d2e;
        plVar7 = (long *)std::istream::get((char *)&ss);
        if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0)
        goto LAB_00110d59;
        bVar1 = is_hex_digit((byte)functions.
                                   super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
        if (!bVar1) goto LAB_00110d84;
        hex_digit_to_int((byte)functions.
                               super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                               _M_impl.super__Vector_impl_data._M_start);
        plVar7 = (long *)std::istream::get((char *)&ss);
        if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0)
        goto LAB_00110dda;
        bVar1 = is_hex_digit((byte)functions.
                                   super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
        if (!bVar1) goto LAB_00110daf;
        hex_digit_to_int((byte)functions.
                               super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                               _M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::push_back(cVar15);
        goto LAB_001102a9;
      }
      if ((byte)functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                super__Vector_impl_data._M_start != '\"') {
LAB_001103d3:
        std::__cxx11::string::push_back(cVar15);
        goto LAB_001102a9;
      }
      if ((pointer)0xffff <
          start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_00110f32;
      std::variant<std::__cxx11::string,int,double>::operator=
                ((variant<std::__cxx11::string,int,double> *)&parseInstructions.ss,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&start);
    }
    else {
      bVar1 = std::operator==(&type,"I");
      if (bVar1) {
        parseInstructions.readLine =
             (anon_class_32_4_7e715f1c *)CONCAT71(parseInstructions.readLine._1_7_,1);
        *(uint *)(local_2b0 + *(long *)(_ss + -0x18)) =
             *(uint *)(local_2b0 + *(long *)(_ss + -0x18)) | 0x1000;
        piVar6 = std::operator>>((istream *)&ss,(string *)&start);
        if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) goto LAB_0011108a;
        std::__cxx11::string::string((string *)&local_a0,(string *)&start);
        iVar3 = try_to_int(&local_a0);
        functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(functions.
                               super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,iVar3);
        std::variant<std::__cxx11::string,int,double>::operator=
                  ((variant<std::__cxx11::string,int,double> *)&parseInstructions.ss,
                   (int *)&functions);
        s = &local_a0;
      }
      else {
        bVar1 = std::operator==(&type,"D");
        if (!bVar1) goto LAB_001110b5;
        parseInstructions.readLine =
             (anon_class_32_4_7e715f1c *)CONCAT71(parseInstructions.readLine._1_7_,2);
        *(uint *)(local_2b0 + *(long *)(_ss + -0x18)) =
             *(uint *)(local_2b0 + *(long *)(_ss + -0x18)) | 0x1000;
        piVar6 = std::operator>>((istream *)&ss,(string *)&start);
        if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) goto LAB_0011105f;
        s = &local_c0;
        std::__cxx11::string::string((string *)s,(string *)&start);
        functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)try_to_double(s);
        std::variant<std::__cxx11::string,int,double>::operator=
                  ((variant<std::__cxx11::string,int,double> *)&parseInstructions.ss,
                   (double *)&functions);
      }
      std::__cxx11::string::~string((string *)s);
    }
    std::vector<vm::Constant,_std::allocator<vm::Constant>_>::emplace_back<vm::Constant>
              (&constants,(Constant *)&parseInstructions);
    parse_file_text::anon_class_16_2_9d8d2ce4::operator()(&ensureNoMoreInput);
    std::__cxx11::string::~string((string *)&start);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::string::~string((string *)&temp);
    std::__detail::__variant::
    _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
    ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                         *)&parseInstructions.ss);
  }
  parse_file_text::anon_class_16_2_51529e6d::operator()(&reuseLine);
  std::__cxx11::string::~string((string *)&start);
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&temp);
  std::__detail::__variant::
  _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
  ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                       *)&parseInstructions.ss);
  if (0xffff < (ulong)(((long)constants.
                              super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)constants.
                             super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl
                             .super__Vector_impl_data._M_start) / 0x30)) goto LAB_00111164;
  parseInstructions.readLine = &readLine;
  parseInstructions.reuseLine = &reuseLine;
  parseInstructions.errorInvalidFile = &errorInvalidFile;
  parseInstructions.ensureNoMoreInput = &ensureNoMoreInput;
  start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parseInstructions.ss = &ss;
  std::operator>>((istream *)&ss,(string *)&str);
  bVar1 = std::operator==(&str,".start:");
  if (!bVar1) goto LAB_00111192;
  parse_file_text::anon_class_16_2_9d8d2ce4::operator()(&ensureNoMoreInput);
  parse_file_text::anon_class_40_5_6335b36b::operator()
            ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)&temp,&parseInstructions);
  std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::_M_move_assign(&start,&temp);
  std::_Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>::~_Vector_base
            ((_Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_> *)&temp);
  functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator>>((istream *)&ss,(string *)&str);
  bVar1 = std::operator==(&str,".functions:");
  if (!bVar1) goto LAB_001111bd;
  parse_file_text::anon_class_16_2_9d8d2ce4::operator()(&ensureNoMoreInput);
  bVar13 = 0;
  do {
    parse_file_text::anon_class_32_4_7e715f1c::operator()(&readLine);
    temp._M_string_length = 0;
    temp.field_2._M_allocated_capacity = 0;
    temp.field_2._8_8_ = 0;
    type._M_dataplus._M_p = (pointer)&type.field_2;
    type._M_string_length = 0;
    type.field_2._M_local_buf[0] = '\0';
    piVar6 = std::operator>>((istream *)&ss,(string *)&type);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
      std::__cxx11::string::string((string *)&local_50,(string *)&type);
      iVar3 = try_to_int(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if ((long)functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                super__Vector_impl_data._M_start >> 5 != (long)iVar3) goto LAB_00110f88;
      piVar6 = std::operator>>((istream *)&ss,(string *)&type);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) goto LAB_00110fde;
      std::__cxx11::string::string((string *)&local_e0,(string *)&type);
      iVar3 = try_to_int(&local_e0);
      temp._M_dataplus._M_p._0_2_ = (short)iVar3;
      std::__cxx11::string::~string((string *)&local_e0);
      uVar12 = (ulong)temp._M_dataplus._M_p & 0xffff;
      if ((ulong)(((long)constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x30) <= uVar12)
      goto LAB_00110fb3;
      if (constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12].type != STRING) goto LAB_00111009;
      pvVar9 = std::get<0ul,std::__cxx11::string,int,double>
                         (&constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar12].value);
      bVar1 = std::operator==(pvVar9,"main");
      piVar6 = std::operator>>((istream *)&ss,(string *)&type);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) goto LAB_00110f5d;
      std::__cxx11::string::string((string *)&local_100,(string *)&type);
      iVar3 = try_to_int(&local_100);
      temp._M_dataplus._M_p._2_2_ = (short)iVar3;
      std::__cxx11::string::~string((string *)&local_100);
      piVar6 = std::operator>>((istream *)&ss,(string *)&type);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) goto LAB_00111034;
      std::__cxx11::string::string((string *)&local_120,(string *)&type);
      iVar3 = try_to_int(&local_120);
      temp._M_dataplus._M_p._4_2_ = (short)iVar3;
      std::__cxx11::string::~string((string *)&local_120);
      std::vector<vm::Function,_std::allocator<vm::Function>_>::emplace_back<vm::Function>
                (&functions,(Function *)&temp);
      parse_file_text::anon_class_16_2_9d8d2ce4::operator()(&ensureNoMoreInput);
      bVar13 = bVar13 | bVar1;
      bVar1 = true;
    }
    else {
      parse_file_text::anon_class_16_2_51529e6d::operator()(&reuseLine);
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&type);
    std::_Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>::~_Vector_base
              ((_Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_> *)
               &temp._M_string_length);
  } while (bVar1);
  if (bVar13 == 0) goto LAB_001111e8;
  uVar12 = (ulong)((long)functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 5;
  iVar11 = (int)uVar12;
  if (iVar11 < 0x10000) {
    iVar5 = 0;
    uVar14 = 0;
    if (0 < iVar11) {
      uVar14 = uVar12 & 0xffffffff;
    }
    while( true ) {
      type._M_dataplus._M_p._0_4_ = iVar5;
      local_940 = uVar12;
      if (iVar11 <= iVar5) break;
      piVar6 = std::operator>>((istream *)&ss,(string *)&str);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) goto LAB_00110e86;
      if ((str._M_string_length < 2) || (str._M_dataplus._M_p[str._M_string_length - 1] != ':'))
      goto LAB_00110e05;
      std::__cxx11::string::pop_back();
      if (*str._M_dataplus._M_p == '.') {
        std::__cxx11::string::erase(&str);
        std::__cxx11::stringbuf::str(local_2b0);
        std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + (int)&ss);
        *(uint *)(local_2b0 + *(long *)(_ss + -0x18)) =
             *(uint *)(local_2b0 + *(long *)(_ss + -0x18)) | 0x1000;
        std::operator>>((istream *)&ss,&ch_1);
        __n = 0xffffffff;
        if ((ch_1 & 0xdfU) == 0x46) {
          temp._M_dataplus._M_p = (pointer)&temp.field_2;
          temp._M_string_length = 0;
          temp.field_2._M_allocated_capacity =
               temp.field_2._M_allocated_capacity & 0xffffffffffffff00;
          piVar6 = std::operator>>((istream *)&ss,(string *)&temp);
          if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) goto LAB_001110e0;
          std::__cxx11::string::string((string *)&local_140,(string *)&temp);
          uVar4 = try_to_int(&local_140);
          __n = (ulong)uVar4;
          std::__cxx11::string::~string((string *)&local_140);
          if (uVar4 != (uint)type._M_dataplus._M_p) goto LAB_0011110b;
          std::__cxx11::string::~string((string *)&temp);
        }
      }
      else {
        for (__n = 0; uVar14 != __n; __n = __n + 1) {
          pvVar10 = std::vector<vm::Function,_std::allocator<vm::Function>_>::at(&functions,__n);
          pvVar8 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::at
                             (&constants,(ulong)pvVar10->nameIndex);
          pvVar9 = std::get<0ul,std::__cxx11::string,int,double>(&pvVar8->value);
          _Var2 = std::operator==(pvVar9,&str);
          if (_Var2) goto LAB_00110b41;
        }
        __n = 0xffffffff;
      }
LAB_00110b41:
      parse_file_text::anon_class_16_2_9d8d2ce4::operator()(&ensureNoMoreInput);
      if ((int)__n < 0) goto LAB_00110eb1;
      parse_file_text::anon_class_40_5_6335b36b::operator()
                ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)&temp,
                 &parseInstructions);
      pvVar10 = std::vector<vm::Function,_std::allocator<vm::Function>_>::at
                          (&functions,__n & 0xffffffff);
      std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::_M_move_assign
                (&pvVar10->instructions,&temp);
      std::_Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>::~_Vector_base
                ((_Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_> *)&temp);
      iVar5 = (uint)type._M_dataplus._M_p + 1;
    }
    piVar6 = std::operator>>((istream *)in,(string *)&str);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
      local_808.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
      super__Vector_impl_data._M_start =
           constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_808.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
      super__Vector_impl_data._M_finish =
           constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_808.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_828._M_impl.super__Vector_impl_data._M_start =
           start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_828._M_impl.super__Vector_impl_data._M_finish =
           start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_828._M_impl.super__Vector_impl_data._M_end_of_storage =
           start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_848.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
      super__Vector_impl_data._M_start =
           functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_848.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
      super__Vector_impl_data._M_finish =
           functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_848.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      File(__return_storage_ptr__,1,&local_808,
           (vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)&local_828,&local_848);
      std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector(&local_848);
      std::_Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>::~_Vector_base
                (&local_828);
      std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_808);
      std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector(&functions);
      std::_Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>::~_Vector_base
                (&start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>);
      std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&constants);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::string::~string((string *)&line);
      return __return_storage_ptr__;
    }
    goto LAB_0011123e;
  }
  goto LAB_00111213;
LAB_00110e05:
  strfmt<int>(&local_728,"\".F{}:\" expected",(int *)&type);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_728);
LAB_00110e30:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"unordered index",(allocator<char> *)&functions);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_308);
LAB_00110e5b:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"constant type expected",(allocator<char> *)&functions);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_328);
LAB_00110e86:
  strfmt<int>(&local_708,"\".F{}:\" expected",(int *)&type);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_708);
LAB_00110eb1:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a8,"no such function",(allocator<char> *)&temp);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_7a8);
LAB_00110edc:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,"no leading qoute for string constant",(allocator<char> *)&ch_1);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_368);
LAB_00110f07:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"string constant expected",(allocator<char> *)&ch_1);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_348);
LAB_00110f32:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"too long the string constant",(allocator<char> *)&ch_1);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_468);
LAB_00110f5d:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"param_size expected",(allocator<char> *)&ch_1);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_628);
LAB_00110f88:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"unordered index",(allocator<char> *)&ch_1);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_588);
LAB_00110fb3:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_5e8,"name not found",(allocator<char> *)&ch_1);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,local_5e8);
LAB_00110fde:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"name_index expected",(allocator<char> *)&ch_1);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_5a8);
LAB_00111009:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"name not found",(allocator<char> *)&ch_1);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_608);
LAB_00111034:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_668,"level expected",(allocator<char> *)&ch_1);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,local_668);
LAB_0011105f:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4c8,"invalid format",(allocator<char> *)&functions);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,local_4c8);
LAB_0011108a:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"invalid format",(allocator<char> *)&functions);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_488);
LAB_001110b5:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_508,"invalid constant type",(allocator<char> *)&functions);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,local_508);
LAB_001110e0:
  strfmt<int>(&local_748,"\".F{}:\" expected",(int *)&type);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_748);
LAB_0011110b:
  strfmt<int>(local_788,"\".F{}:\" expected",(int *)&type);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,local_788);
LAB_00111136:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,".constants expected",(allocator<char> *)&parseInstructions);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_528);
LAB_00111164:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"too many constants",(allocator<char> *)&parseInstructions);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_548);
LAB_00111192:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,".start expected",(allocator<char> *)&temp);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_568);
LAB_001111bd:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_6a8,".functions expected",(allocator<char> *)&temp);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,local_6a8);
LAB_001111e8:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c8,"main() not found",(allocator<char> *)&temp);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_6c8);
LAB_00111213:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"too many functions",(allocator<char> *)&temp);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_6e8);
LAB_0011123e:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c8,"unused content",(allocator<char> *)&temp);
  parse_file_text::anon_class_8_1_02a47b0a::operator()(&errorInvalidFile,&local_7c8);
  std::__cxx11::string::~string((string *)&type);
  std::_Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>::~_Vector_base
            ((_Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_> *)
             &temp._M_string_length);
  std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector(&functions);
  std::_Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>::~_Vector_base
            (&start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>);
  std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&constants);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::~string((string *)&line);
  _Unwind_Resume(local_940);
}

Assistant:

File File::parse_file_text(std::ifstream& in) {
    int line_count = 0;
    std::string line = "";
    std::string str = "";
    std::stringstream ss;
    const auto readLine = [&]() {
        while(std::getline(in, line)) {
            ++line_count;
            // remove comment
            if (auto ed = line.find_first_of('#'); ed != std::string::npos) {
                line.resize(ed); 
                // line.erase(line.begin()+ed, line.end());
            }
            // remove leading and trailing whitespaces
            line = trim(std::move(line));
            // not a blank line     
            if (!line.empty()) {
                ss.str(line);
                ss.clear();
                return;
            }
        }
        // eof
        line = "";
        ss.str("");
        ss.clear();
    };
    const auto reuseLine = [&]() {
        ss.str(line);
        ss.clear();
    };
    const auto errorLineInfo = [&]() {
        println(std::cerr, "line", line_count, ":\n   ", line);
    };
    const auto errorInvalidFile = [&](std::string msg) {
        errorLineInfo();
        throw InvalidFile(msg);
    };
    #define errorIf(cond, msg)    do { if ((cond)) { errorInvalidFile((msg)); } } while(false)
    #define errorIfNot(cond, msg) errorIf(!(cond), (msg))
    #define errorIfAssignFailed(lhs, rhs, msg) do { try { lhs = (rhs); } catch (const std::exception&) { errorIf(true, (msg)); } } while(false)
    auto ensureNoMoreInput = [&]() {
        if (char ch; ss >> std::skipws >> ch) {
            errorIf(true, "invalid line");
        }
    };

    readLine();

    // parse constants
    std::vector<vm::Constant> constants;
    ss >> str;
    if (str == ".constants:") {
        ensureNoMoreInput();
        while (true) {
            // {index} {type} {value}
            readLine();
            vm::Constant constant;
            std::string temp;
            int index;
            std::string type;
            std::string value;
            // eof
            if (!(ss >> temp)) { 
                reuseLine(); break; 
            }
            // parse index
            try {
                index = try_to_int(temp);
            }
            catch (const std::exception&) {
                reuseLine(); break;
            }
            errorIf(index != constants.size(), "unordered index");
            errorIfNot(ss >> type, "constant type expected");
            if (type == "S") {
                constant.type = vm::Constant::Type::STRING;
                char ch;
                errorIfNot(ss >> std::skipws >> ch, "string constant expected");
                errorIf(ch != '\"', "no leading qoute for string constant");
                // parse the content of string
                while (true) {
                    errorIfNot(ss.get(ch), "no trailing quote for string constant");
                    if (ch == '\"') { 
                        break; 
                    }
                    if (ch == '\\') {
                        errorIfNot(ss.get(ch), "incomplete escape seq");
                        switch (ch) {
                        case '\\': value += '\\'; break;
                        case '\'': value += '\''; break;
                        case '\"': value += '\"'; break;
                        case 'n':  value += '\n'; break;
                        case 'r':  value += '\r'; break;
                        case 't':  value += '\t'; break;
                        case 'x': {
                            errorIfNot(ss.get(ch), "incomplete hex escape seq");
                            errorIfNot(is_hex_digit(ch), "invalid hex escape seq");
                            char v = (0xff & hex_digit_to_int(ch)) << 4;
                            errorIfNot(ss.get(ch), "incomplete hex escape seq");
                            errorIfNot(is_hex_digit(ch), "invalid hex escape seq");
                            v |= (0xff & hex_digit_to_int(ch));
                            value += v;
                        }; break;
                        default: errorIf(true, strfmt("unknown escape seq \"\\{}\"", ch));
                        }
                    }
                    else {
                        value += ch;
                    }
                }
                errorIf(value.length() > UINT16_MAX, "too long the string constant");
                constant.value = std::move(value);
            }
            else if (type == "I") {
                constant.type = vm::Constant::Type::INT;
                errorIfNot(ss >> std::skipws >> value, "invalid format");
                errorIfAssignFailed(constant.value, try_to_int(value), "out of range or invalid format");
            }
            else if (type == "D") {
                constant.type = vm::Constant::Type::DOUBLE;
                errorIfNot(ss >> std::skipws >> value, "invalid format");
                errorIfAssignFailed(constant.value, try_to_double(value), "out of range or invalid format");
            }
            else {
                errorIf(true, "invalid constant type");
            }
            constants.push_back(std::move(constant));
            ensureNoMoreInput();
        }
    }
    else {
        errorIf(true, ".constants expected");
    }
    errorIf(constants.size() > U2_MAX, "too many constants");

    // parse instructions
    auto parseInstructions = [&]() {
        std::vector<vm::Instruction> rtv;
        while(true) {
            // {index} {opcode} {param1} {param2}
            readLine();
            std::string temp;
            int index;
            std::string opName;
            // eof
            if (!(ss >> temp)) { 
                reuseLine(); break; 
            }
            // parse index
            try {
                index = try_to_int(temp);
            }
            catch (const std::exception&) {
                reuseLine(); break;
            }
            errorIf(index != rtv.size(), "unordered index");
            errorIfNot(ss >> opName, "opcode expected");
            opName = to_lower(opName);
            vm::Instruction ins;
            if (auto it = vm::opCodeOfName.find(opName); true) {
                errorIf(it == vm::opCodeOfName.end(), "no such opcode");
                ins.op = it->second;
            }
            if (auto it = vm::paramSizeOfOpCode.find(ins.op); it != vm::paramSizeOfOpCode.end()) {
                int paramCount = it->second.size();
                std::string restLine;
                errorIfNot(std::getline(ss, restLine), "parameters expected");
                auto params = split(restLine, ',');
                errorIf(params.size() != paramCount, 
                    strfmt("{} parameters expected, {} got", paramCount, params.size())
                );
                errorIfAssignFailed(ins.x, try_to_int(params[0]), 
                    strfmt("invalid first parameter: {}", params[0])
                );
                if (paramCount == 2) {
                    errorIfAssignFailed(ins.y, try_to_int(params[1]), 
                        strfmt("invalid second parameter: {}", params[1])
                    );
                }
            }
            ensureNoMoreInput();
            rtv.push_back(ins);
        }
        errorIf(rtv.size() > U2_MAX, "too many instructions");
        return rtv;
    };

    // parse start
    std::vector<vm::Instruction> start;
    ss >> str;
    if (str == ".start:") {
        ensureNoMoreInput();
        start = std::move(parseInstructions());
    }
    else {
        errorIf(true, ".start expected");
    }

    // parse functions
    std::vector<vm::Function> functions;
    bool mainFound = false;
    ss >> str;
    if (str == ".functions:") {
        ensureNoMoreInput();
        while (true) {
            // {index} {nameIndex} {paramSize} {level}
            readLine();
            vm::Function function;
            std::string temp;
            int index;
            // no more function
            if (!(ss >> temp)) { 
                reuseLine(); break; 
            }
            // parse index
            try {
                index = try_to_int(temp);
            }
            catch (const std::exception&) {
                reuseLine(); break;
            }
            errorIf(index != functions.size(), "unordered index");
            errorIfNot(ss >> temp, "name_index expected");
            errorIfAssignFailed(function.nameIndex, try_to_int(temp), "invalid name_index");
            errorIf(function.nameIndex >= constants.size(), "name not found");
            errorIf(constants[function.nameIndex].type != vm::Constant::Type::STRING, "name not found");
            if (std::get<vm::str_t>(constants[function.nameIndex].value) == "main") {
                mainFound = true;
            }
            errorIfNot(ss >> temp, "param_size expected");
            errorIfAssignFailed(function.paramSize, try_to_int(temp), "invalid param_size");
            errorIf(function.paramSize > U2_MAX, "too many parameters");
            errorIfNot(ss >> temp, "level expected");
            errorIfAssignFailed(function.level, try_to_int(temp), "invalid level");
            errorIf(function.level > U2_MAX, "too high the level");
            functions.push_back(std::move(function));
            ensureNoMoreInput();
        }
    }
    else {
        errorIf(true, ".functions expected");
    }
    errorIfNot(mainFound, "main() not found");

    int functions_count = functions.size();
    errorIf(functions_count > U2_MAX, "too many functions");
    for (int i = 0; i < functions_count; ++i) {
        errorIfNot(ss >> str, strfmt("\".F{}:\" expected", i));
        errorIf((str.length() < 2 || str.back() != ':'), strfmt("\".F{}:\" expected", i));
        str.pop_back();

        int index = -1;
        if (str.front() == '.') {
            str.erase(str.begin());
            ss.str(str);
            ss.clear();
            char ch;
            ss >> std::skipws >> ch;
            if ((ch == 'F' || ch == 'f')) {
                // .Fx
                std::string temp;
                errorIfNot(ss >> temp, strfmt("\".F{}:\" expected", i));
                errorIfAssignFailed(index, try_to_int(temp), "invalid function index");
                errorIf(index != i, strfmt("\".F{}:\" expected", i));
            }
        }
        else {
            // str is name
            index = -1;
            for (auto j = 0; j < functions_count; ++j) {
                if (std::get<std::string>(constants.at(functions.at(j).nameIndex).value) == str) {
                    index = j;
                    break;
                }
            } 
        }
        ensureNoMoreInput();
        errorIf(index < 0, "no such function");
        functions.at(index).instructions = std::move(parseInstructions());
    }

    errorIf(in >> str, "unused content");

    return File{0x00000001, std::move(constants), std::move(start), std::move(functions)};
}